

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadXYZnodeBodyBushing::ChLoadXYZnodeBodyBushing
          (ChLoadXYZnodeBodyBushing *this,shared_ptr<chrono::ChNodeXYZ> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChFunction *__tmp;
  shared_ptr<chrono::ChBody> local_48;
  shared_ptr<chrono::ChNodeXYZ> local_38;
  
  local_38.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  p_Var1 = (mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  p_Var1 = (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChLoadXYZnodeBody::ChLoadXYZnodeBody(&this->super_ChLoadXYZnodeBody,&local_38,&local_48);
  if (local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_38.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoadXYZnodeBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZnodeBodyBushing_00b21cb8;
  (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->R).m_data[0] = 0.0;
  (this->R).m_data[1] = 0.0;
  (this->R).m_data[2] = 0.0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  dVar2 = DAT_00b689a0;
  if (this != (ChLoadXYZnodeBodyBushing *)(sBulletDNAstr64 + 0x3510)) {
    (this->R).m_data[0] = VNULL;
    (this->R).m_data[1] = dVar2;
    (this->R).m_data[2] = DAT_00b689a8;
  }
  this->is_stiff = false;
  return;
}

Assistant:

ChLoadXYZnodeBodyBushing::ChLoadXYZnodeBodyBushing(std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node to apply load to
								  std::shared_ptr<ChBody> mbodyB   ///< node to apply load to as reaction
								  )	
    : ChLoadXYZnodeBody(mnodeA, mbodyB)
     {
	force_dX = chrono_types::make_shared<ChFunction_Const>(0.0);
	force_dY = chrono_types::make_shared<ChFunction_Const>(0.0);
	force_dZ = chrono_types::make_shared<ChFunction_Const>(0.0);
	R = VNULL;
	is_stiff = false;
}